

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::initializeAuthority(XMLUri *this,XMLCh *uriSpec)

{
  short *psVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  XMLCh *toDelete_00;
  XMLCh *pXVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ArrayJanitor<char16_t> portName;
  ArrayJanitor<char16_t> hostName;
  ArrayJanitor<char16_t> userName;
  ulong local_78;
  ulong local_70;
  ArrayJanitor<char16_t> local_60;
  ArrayJanitor<char16_t> local_50;
  ArrayJanitor<char16_t> local_40;
  XMLCh *toDelete;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  uVar10 = 0;
  if (uriSpec != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)uriSpec + uVar10);
      uVar10 = uVar10 + 2;
    } while (*psVar1 != 0);
    uVar10 = ((long)uVar10 >> 1) - 1;
  }
  lVar2 = uVar10 * 2 + 2;
  iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar2);
  toDelete = (XMLCh *)CONCAT44(extraout_var,iVar4);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
  iVar4 = XMLString::indexOf(uriSpec,L'@');
  if (iVar4 == -1) {
    toDelete = (XMLCh *)0x0;
    local_78 = 0;
  }
  else {
    XMLString::subString(toDelete,uriSpec,0,(long)iVar4,this->fMemoryManager);
    local_78 = (ulong)(iVar4 + 1);
  }
  iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar2);
  toDelete_00 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_50,toDelete_00,this->fMemoryManager);
  pXVar7 = uriSpec + local_78;
  if ((uVar10 < local_78 || uVar10 - local_78 == 0) || (uriSpec[local_78] != L'[')) {
    uVar5 = XMLString::indexOf(pXVar7,L':');
  }
  else {
    iVar4 = XMLString::indexOf(pXVar7,L']');
    uVar5 = 0xffffffff;
    if ((iVar4 != -1) && (uVar8 = (long)iVar4 + local_78 + 1, uVar8 < uVar10)) {
      uVar5 = 0xffffffff;
      if (uriSpec[uVar8] == L':') {
        uVar5 = iVar4 + 1;
      }
    }
  }
  if (uVar5 == 0xffffffff) {
    XMLString::subString(toDelete_00,pXVar7,0,uVar10 - local_78,this->fMemoryManager);
    local_70 = uVar10;
  }
  else {
    XMLString::subString(toDelete_00,pXVar7,0,(long)(int)uVar5,this->fMemoryManager);
    local_70 = local_78 + (long)(int)uVar5 + 1;
  }
  iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar2);
  pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_60,pXVar7,this->fMemoryManager);
  iVar4 = -1;
  if ((((toDelete_00 != (XMLCh *)0x0) && (*toDelete_00 != L'\0' && uVar5 < 0xfffffffe)) &&
      (local_70 <= uVar10 && uVar10 - local_70 != 0)) &&
     ((XMLString::subString(pXVar7,uriSpec + local_70,0,uVar10 - local_70,this->fMemoryManager),
      pXVar7 != (XMLCh *)0x0 && (*pXVar7 != L'\0')))) {
    iVar4 = XMLString::parseInt(pXVar7,this->fMemoryManager);
  }
  bVar3 = isValidServerBasedAuthority(toDelete_00,iVar4,toDelete,this->fMemoryManager);
  if (bVar3) {
    if (this->fHost != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (this->fUserInfo != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (toDelete_00 == (XMLCh *)0x0) {
      pXVar7 = (XMLCh *)0x0;
    }
    else {
      sVar9 = 0;
      do {
        psVar1 = (short *)((long)toDelete_00 + sVar9);
        sVar9 = sVar9 + 2;
      } while (*psVar1 != 0);
      iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar9);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_02,iVar6);
      memcpy(pXVar7,toDelete_00,sVar9);
    }
    this->fHost = pXVar7;
    this->fPort = iVar4;
    if (toDelete == (XMLCh *)0x0) {
      pXVar7 = (XMLCh *)0x0;
    }
    else {
      sVar9 = 0;
      do {
        psVar1 = (short *)((long)toDelete + sVar9);
        sVar9 = sVar9 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar9);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
      memcpy(pXVar7,toDelete,sVar9);
    }
    this->fUserInfo = pXVar7;
  }
  else {
    setRegBasedAuthority(this,uriSpec);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_60);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
}

Assistant:

void XMLUri::initializeAuthority(const XMLCh* const uriSpec)
{

    int index = 0;
    XMLSize_t start = 0;
    const XMLSize_t end = XMLString::stringLen(uriSpec);

    //
    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    //
    XMLCh* userinfo = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> userName(userinfo, fMemoryManager);
    index = XMLString::indexOf(&(uriSpec[start]), chAt);

    if ( index != -1)
    {
        XMLString::subString(userinfo, &(uriSpec[start]), 0, index, fMemoryManager);
        index++; // skip the @
        start += index;
    }
    else
    {
        userinfo = 0;
    }

    //
    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    XMLCh* host = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> hostName(host, fMemoryManager);

    // Search for port boundary.
    if (start < end && uriSpec[start] == chOpenSquare)
    {
    	index = XMLString::indexOf(&(uriSpec[start]), chCloseSquare);
    	if (index != -1)
    	{
            // skip the ']'
            index = ((start + index + 1) < end
              && uriSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(uriSpec[start]), chColon);
    }

    if ( index != -1 )
    {
        XMLString::subString(host, &(uriSpec[start]), 0, index, fMemoryManager);
        index++;  // skip the :
        start +=index;
    }
    else
    {
        XMLString::subString(host, &(uriSpec[start]), 0, end-start, fMemoryManager);
        start = end;
    }

    // port is everything after ":"

    XMLCh* portStr = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> portName(portStr, fMemoryManager);
    int port = -1;

    if ((host && *host) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < end)                     )   // ":" is not the last
    {
        XMLString::subString(portStr, &(uriSpec[start]), 0, end-start, fMemoryManager);

        if (portStr && *portStr)
        {
            port = XMLString::parseInt(portStr, fMemoryManager);
        }
    } // if > 0

    // Check if we have server based authority.
    if (isValidServerBasedAuthority(host, port, userinfo, fMemoryManager))
    {
        if (fHost)
            fMemoryManager->deallocate(fHost);//delete [] fHost;

        if (fUserInfo)
            fMemoryManager->deallocate(fUserInfo);//delete[] fUserInfo;

        fHost = XMLString::replicate(host, fMemoryManager);
        fPort = port;
        fUserInfo = XMLString::replicate(userinfo, fMemoryManager);

        return;
    }
    // This must be registry based authority or the URI is malformed.
    setRegBasedAuthority(uriSpec);
}